

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_dispatch.cpp
# Opt level: O3

void __kmp_dispatch_init_algorithm<unsigned_long_long>
               (ident_t *loc,int gtid,dispatch_private_info_template<unsigned_long_long> *pr,
               sched_type schedule,unsigned_long_long lb,unsigned_long_long ub,signed_t_conflict st,
               kmp_uint64 *cur_chunk,signed_t_conflict chunk,unsigned_long_long nproc,
               unsigned_long_long tid)

{
  float fVar1;
  float fVar2;
  int iVar3;
  kmp_info_t *pkVar4;
  kmp_team_p *pkVar5;
  ulong uVar6;
  ulong uVar7;
  kmp_int64 *pkVar8;
  unsigned_long_long uVar9;
  unsigned_long_long uVar10;
  sched_type sVar11;
  ulong uVar12;
  sched_type *psVar13;
  ulong uVar14;
  unsigned_long_long uVar15;
  ulong uVar16;
  sched_type sVar17;
  uint uVar18;
  UT UVar19;
  sched_type sVar20;
  unsigned_long_long nth;
  bool bVar21;
  bool bVar22;
  longdouble lVar23;
  longdouble lVar24;
  longdouble lVar25;
  longdouble lVar26;
  longdouble lVar27;
  undefined1 auVar28 [16];
  kmp_msg_t local_78;
  kmp_msg_t local_60;
  kmp_msg_t local_48;
  
  pkVar4 = __kmp_threads[gtid];
  pkVar5 = (pkVar4->th).th_team;
  iVar3 = (pkVar5->t).t_serialized;
  bVar22 = false;
  if ((__kmp_itt_metadata_add_ptr__3_0 != (__kmp_itt_metadata_add_t *)0x0) &&
     (bVar22 = false, __kmp_forkjoin_frames_mode == 3)) {
    if ((*(int *)(pkVar4->th_pad + 0x20) == 0) &&
       ((pkVar4->th).th_teams_microtask == (microtask_t)0x0)) {
      bVar22 = (pkVar5->t).t_active_level == 1;
    }
    else {
      bVar22 = false;
    }
  }
  sVar17 = schedule & ~(kmp_sch_modifier_nonmonotonic|kmp_sch_modifier_monotonic);
  bVar21 = sVar17 - kmp_nm_lower < 0x28;
  uVar18 = ((uint)pr->flags & 0xfffffffd) + (uint)bVar21 * 2;
  sVar11 = sVar17 - 0x80;
  if (!bVar21) {
    sVar11 = sVar17;
  }
  pr->type_size = 8;
  bVar21 = (sVar11 & kmp_ord_lower) != 0;
  if (bVar21) {
    pr->flags = (kmp_sched_flags_t)(uVar18 | 1);
    sVar11 = sVar11 - kmp_sch_lower;
  }
  else {
    pr->flags = (kmp_sched_flags_t)(uVar18 & 0xfffffffe);
  }
  bVar21 = bVar21 || (schedule >> 0x1e & 1) == 0;
  if (sVar11 == kmp_sch_runtime) {
    sVar17 = (pkVar5->t).t_sched.field_0.r_sched_type;
    bVar21 = (sVar17 >> 0x1e & 1) == 0;
    sVar17 = sVar17 & ~(kmp_sch_modifier_nonmonotonic|kmp_sch_modifier_monotonic);
    if (sVar17 == kmp_sch_default) {
      psVar13 = &__kmp_static;
LAB_00159e59:
      sVar17 = *psVar13;
    }
    else if (sVar17 == kmp_sch_guided_chunked) {
      psVar13 = &__kmp_guided;
      goto LAB_00159e59;
    }
    chunk = (signed_t_conflict)(pkVar5->t).t_sched.field_0.chunk;
    if (cur_chunk != (kmp_uint64 *)0x0) {
      *cur_chunk = chunk;
    }
LAB_00159e6d:
    if (sVar17 == kmp_sch_auto) {
      sVar17 = __kmp_auto;
    }
    sVar20 = kmp_sch_static_steal;
    if (bVar21 || sVar17 != kmp_sch_dynamic_chunked) {
      sVar20 = sVar17;
    }
    if ((nproc < 0x100001) || (sVar20 != kmp_sch_guided_analytical_chunked)) {
      if (sVar20 == kmp_sch_runtime_simd) {
        sVar11 = (pkVar5->t).t_sched.field_0.r_sched_type;
        sVar20 = kmp_sch_static_balanced_chunked;
        if (((sVar11 & 0x9ffffffb) != kmp_sch_default) &&
           (sVar11 = sVar11 & ~(kmp_sch_modifier_nonmonotonic|kmp_sch_modifier_monotonic),
           sVar11 != __kmp_static)) {
          sVar20 = sVar11;
          if (sVar11 == __kmp_guided) {
            sVar20 = kmp_sch_guided_simd;
          }
          if (sVar11 == kmp_sch_guided_chunked) {
            sVar20 = kmp_sch_guided_simd;
          }
          chunk = chunk * (pkVar5->t).t_sched.field_0.chunk;
        }
        if (cur_chunk != (kmp_uint64 *)0x0) {
          *cur_chunk = chunk;
        }
      }
    }
    else {
      __kmp_msg_format(&local_48,0x40059);
      __kmp_msg(kmp_ms_warning);
      sVar20 = kmp_sch_guided_iterative_chunked;
    }
    (pr->u).p.field_6.parm1 = chunk;
  }
  else {
    sVar17 = __kmp_guided;
    if ((sVar11 == kmp_sch_guided_chunked) ||
       (sVar20 = __kmp_static, sVar17 = sVar11, sVar11 != kmp_sch_default)) {
      if (chunk < 2) {
        chunk = 1;
      }
      goto LAB_00159e6d;
    }
  }
  if (0xe < sVar20 - kmp_sch_static_chunked) {
    __kmp_debug_assert("assertion failure",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jmellorcrummey[P]llvm-openmp-5/runtime/src/kmp_dispatch.cpp"
                       ,0x118);
  }
  (pr->u).p.count = 0;
  if ((st == 0) && (__kmp_env_consistency_check != 0)) {
    __kmp_error_construct
              (kmp_i18n_msg_CnsLoopIncrZeroProhibited,(uint)pr->flags & ct_parallel | ct_pdo,loc);
LAB_0015a001:
    if (lb <= ub) {
      uVar6 = (ub - lb) / (ulong)st;
LAB_0015a017:
      bVar21 = false;
      goto LAB_0015a01a;
    }
LAB_0015a009:
    bVar21 = false;
LAB_0015a00b:
    uVar6 = 0;
  }
  else {
    if (st != 1) {
      if (-1 < st) goto LAB_0015a001;
      if (lb < ub) goto LAB_0015a009;
      uVar6 = (lb - ub) / (ulong)-st;
      goto LAB_0015a017;
    }
    bVar21 = true;
    uVar6 = ub - lb;
    if (ub < lb) goto LAB_0015a00b;
LAB_0015a01a:
    uVar6 = uVar6 + 1;
  }
  (pr->u).p.lb = lb;
  (pr->u).p.ub = ub;
  (pr->u).p.st = st;
  (pr->u).p.tc = uVar6;
  if ((iVar3 == 0) && (((uint)pr->flags & 1) != 0)) {
    pr->ordered_bumped = 0;
    (pr->u).p.ordered_lower = 1;
    (pr->u).p.ordered_upper = 0;
  }
  sVar11 = sVar20;
  switch(sVar20 - kmp_sch_static_chunked) {
  case 0:
  case 2:
    if ((pr->u).p.field_6.parm1 == 0) {
      (pr->u).p.field_6.parm1 = 1;
    }
    goto LAB_0015a377;
  default:
    __kmp_msg_format(&local_60,0x40058);
    __kmp_msg_format(&local_78,0x50016);
    __kmp_fatal();
  case 6:
    uVar7 = uVar6 / (nproc * 2);
    if (uVar6 < nproc * 2) {
      uVar7 = 1;
    }
    uVar14 = uVar7;
    if ((ulong)chunk < uVar7) {
      uVar14 = chunk;
    }
    if (chunk == 0) {
      uVar14 = 1;
    }
    uVar12 = ((uVar14 + uVar7 + uVar6 * 2) - 1) / (uVar14 + uVar7);
    uVar6 = 2;
    if (2 < uVar12) {
      uVar6 = uVar12;
    }
    (pr->u).p.field_6.parm1 = uVar14;
    (pr->u).p.field_6.parm2 = uVar7;
    (pr->u).p.field_6.parm3 = uVar6;
    (pr->u).p.field_6.parm4 = (uVar7 - uVar14) / (uVar6 - 1);
    sVar11 = kmp_sch_trapezoidal;
    goto LAB_0015a377;
  case 7:
    if (1 < nproc) {
      uVar6 = ((nproc + uVar6) - 1) / nproc;
    }
    break;
  case 8:
    goto switchD_0015a078_caseD_8;
  case 9:
  case 0xd:
    if (1 < nproc) {
      sVar11 = kmp_sch_dynamic_chunked;
      if ((chunk * 2 + 1) * nproc < uVar6) {
        auVar28._8_4_ = (int)(nproc >> 0x20);
        auVar28._0_8_ = nproc;
        auVar28._12_4_ = 0x45300000;
        (pr->u).p.field_6.parm2 = (chunk + 1U) * nproc * 2;
        *(double *)((long)&pr->u + 0x50) =
             0.5 / ((auVar28._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)nproc) - 4503599627370496.0));
        sVar11 = sVar20;
      }
      goto LAB_0015a377;
    }
    break;
  case 10:
    if (1 < nproc) {
      sVar11 = kmp_sch_dynamic_chunked;
      if ((chunk * 2 + 1) * nproc < uVar6) {
        fVar1 = *(float *)(&DAT_0017e968 + (ulong)((long)nproc < 0) * 4);
        fVar2 = *(float *)(&DAT_0017e968 + (ulong)((long)uVar6 < 0) * 4);
        lVar27 = (longdouble)-0.5 / ((longdouble)(long)nproc + (longdouble)fVar1) + (longdouble)1;
        *(longdouble *)((long)&pr->u + 0x50) = lVar27;
        uVar7 = 0xe5;
        lVar23 = lVar27;
        lVar26 = (longdouble)1;
        do {
          lVar24 = lVar26 * lVar23;
          if ((uVar7 & 1) == 0) {
            lVar24 = lVar26;
          }
          lVar23 = lVar23 * lVar23;
          bVar22 = 1 < uVar7;
          uVar7 = uVar7 >> 1;
          lVar26 = lVar24;
        } while (bVar22);
        lVar23 = (((longdouble)1 + (longdouble)chunk + (longdouble)chunk) *
                 ((longdouble)(long)nproc + (longdouble)fVar1)) /
                 ((longdouble)(long)uVar6 + (longdouble)fVar2);
        if (lVar24 <= lVar23) {
          uVar7 = 0xe5;
          uVar14 = 0;
        }
        else {
          uVar7 = 0xe5;
          do {
            uVar14 = uVar7;
            lVar24 = lVar24 * lVar24;
            uVar7 = uVar14 * 2;
            if (lVar24 <= lVar23) break;
          } while (uVar14 < 0x4000000);
        }
        if (uVar14 + 1 < uVar7) {
          do {
            uVar12 = uVar7 + uVar14 >> 1;
            lVar26 = (longdouble)1;
            if (1 < uVar7 + uVar14) {
              lVar26 = (longdouble)1;
              uVar16 = uVar12;
              lVar24 = lVar27;
              do {
                lVar25 = lVar26 * lVar24;
                if ((uVar16 & 1) == 0) {
                  lVar25 = lVar26;
                }
                lVar26 = lVar25;
                lVar24 = lVar24 * lVar24;
                bVar22 = 1 < uVar16;
                uVar16 = uVar16 >> 1;
              } while (bVar22);
            }
            if (lVar26 <= lVar23) {
              uVar7 = uVar12;
              uVar12 = uVar14;
            }
            uVar14 = uVar12;
          } while (uVar14 + 1 < uVar7);
          if (uVar7 == 0) {
            __kmp_debug_assert("assertion failure",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jmellorcrummey[P]llvm-openmp-5/runtime/src/kmp_dispatch.cpp"
                               ,0x255);
          }
        }
        lVar26 = (longdouble)1;
        if (uVar7 - 1 != 0) {
          lVar26 = (longdouble)1;
          uVar14 = uVar7 - 1;
          lVar24 = lVar27;
          do {
            lVar25 = lVar26 * lVar24;
            if ((uVar14 & 1) == 0) {
              lVar25 = lVar26;
            }
            lVar26 = lVar25;
            lVar24 = lVar24 * lVar24;
            bVar22 = 1 < uVar14;
            uVar14 = uVar14 >> 1;
          } while (bVar22);
        }
        if (lVar23 < lVar26) {
          uVar14 = uVar7;
          lVar26 = lVar27;
          lVar24 = (longdouble)1;
          do {
            lVar25 = lVar24 * lVar26;
            if ((uVar14 & 1) == 0) {
              lVar25 = lVar24;
            }
            lVar26 = lVar26 * lVar26;
            bVar22 = 1 < uVar14;
            uVar14 = uVar14 >> 1;
            lVar24 = lVar25;
          } while (bVar22);
          if (lVar25 <= lVar23) {
            (pr->u).p.field_6.parm2 = uVar7;
            lVar23 = (longdouble)1;
            uVar14 = uVar7;
            do {
              lVar26 = lVar23 * lVar27;
              if ((uVar14 & 1) == 0) {
                lVar26 = lVar23;
              }
              lVar23 = lVar26;
              lVar27 = lVar27 * lVar27;
              bVar22 = 1 < uVar14;
              uVar14 = uVar14 >> 1;
            } while (bVar22);
            lVar23 = lVar23 * ((longdouble)(long)uVar6 + (longdouble)fVar2);
            lVar27 = (longdouble)9.223372e+18;
            lVar26 = (longdouble)0;
            if (lVar27 <= lVar23) {
              lVar26 = lVar27;
            }
            uVar14 = (ulong)(lVar27 <= lVar23) << 0x3f ^ (long)ROUND(lVar23 - lVar26);
            (pr->u).p.count =
                 (uVar6 - uVar7 * chunk) -
                 ((lVar23 !=
                  (longdouble)(long)uVar14 +
                  (longdouble)*(float *)(&DAT_0017e968 + (ulong)((long)uVar14 < 0) * 4)) + uVar14);
            sVar11 = kmp_sch_guided_analytical_chunked;
            goto LAB_0015a377;
          }
        }
        __kmp_debug_assert("assertion failure",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jmellorcrummey[P]llvm-openmp-5/runtime/src/kmp_dispatch.cpp"
                           ,0x255);
      }
      goto LAB_0015a377;
    }
    break;
  case 0xb:
    uVar7 = (uVar6 / (ulong)chunk + 1) - (ulong)(uVar6 % (ulong)chunk == 0);
    if ((1 < nproc) && (nproc <= uVar7)) {
      uVar6 = uVar7 / nproc;
      uVar7 = uVar7 % nproc;
      uVar9 = tid;
      if (uVar7 < tid) {
        uVar9 = uVar7;
      }
      UVar19 = uVar9 + uVar6 * tid;
      (pr->u).p.count = UVar19;
      (pr->u).p.ub = (tid < uVar7) + uVar6 + UVar19;
      (pr->u).p.field_6.parm2 = lb;
      uVar14 = uVar7 + uVar6;
      if (nproc <= uVar7 + uVar6) {
        uVar14 = nproc;
      }
      (pr->u).p.field_6.parm3 = uVar14;
      (pr->u).p.field_6.parm4 = (tid + 1) % nproc;
      (pr->u).p.st = st;
      pkVar8 = (kmp_int64 *)___kmp_allocate(0x40);
      (((pkVar4->th).th_dispatch)->field_8).th_doacross_info = pkVar8;
      __kmp_init_ticket_lock((((pkVar4->th).th_dispatch)->field_8).th_steal_lock);
      sVar11 = kmp_sch_static_steal;
      goto LAB_0015a377;
    }
switchD_0015a078_caseD_8:
    if (nproc < 2) {
      if (uVar6 == 0) {
LAB_0015a3df:
        (pr->u).p.count = 1;
        (pr->u).p.field_6.parm1 = 0;
        sVar11 = kmp_sch_static_balanced;
        goto LAB_0015a377;
      }
      uVar9 = uVar6 - 1;
      (pr->u).p.field_6.parm1 = 1;
      uVar15 = 0;
    }
    else if (uVar6 < nproc) {
      if (uVar6 <= tid) goto LAB_0015a3df;
      *(ulong *)((long)&pr->u + 0x40) = (ulong)(uVar6 - 1 == tid);
      uVar9 = tid;
      uVar15 = tid;
    }
    else {
      uVar14 = uVar6 % nproc;
      uVar7 = uVar14;
      if (tid <= uVar14) {
        uVar7 = tid;
      }
      uVar15 = uVar7 + (uVar6 / nproc) * tid;
      uVar9 = (uVar6 / nproc + uVar15) - (ulong)(uVar14 <= tid);
      *(ulong *)((long)&pr->u + 0x40) = (ulong)(nproc - 1 == tid);
    }
    if (bVar22 && cur_chunk != (kmp_uint64 *)0x0) {
      *cur_chunk = (uVar9 - uVar15) + 1;
    }
    if (bVar21) {
      (pr->u).p.lb = uVar15 + lb;
      uVar10 = lb + uVar9;
    }
    else {
      uVar10 = uVar9 * st + lb;
      (pr->u).p.lb = uVar15 * st + lb;
      if (st < 1) {
        if (uVar10 + st < ub) {
          uVar10 = ub;
        }
      }
      else if (ub < uVar10 + st) {
        uVar10 = ub;
      }
    }
    (pr->u).p.ub = uVar10;
    sVar11 = kmp_sch_static_balanced;
    if (((uint)pr->flags & 1) != 0) {
      (pr->u).p.ordered_lower = uVar15;
      (pr->u).p.ordered_upper = uVar9;
    }
    goto LAB_0015a377;
  case 0xc:
    if (nproc < 2) break;
    (pr->u).p.field_6.parm1 = -chunk & (((nproc + uVar6) - 1) / nproc + chunk) - 1;
    goto LAB_0015a372;
  }
  (pr->u).p.field_6.parm1 = uVar6;
LAB_0015a372:
  sVar11 = kmp_sch_static_greedy;
LAB_0015a377:
  pr->schedule = sVar11;
  return;
}

Assistant:

void __kmp_dispatch_init_algorithm(ident_t *loc, int gtid,
                                   dispatch_private_info_template<T> *pr,
                                   enum sched_type schedule, T lb, T ub,
                                   typename traits_t<T>::signed_t st,
#if USE_ITT_BUILD
                                   kmp_uint64 *cur_chunk,
#endif
                                   typename traits_t<T>::signed_t chunk,
                                   T nproc, T tid) {
  typedef typename traits_t<T>::unsigned_t UT;
  typedef typename traits_t<T>::floating_t DBL;

  int active;
  T tc;
  kmp_info_t *th;
  kmp_team_t *team;
  int monotonicity;
  bool use_hier;

#ifdef KMP_DEBUG
  typedef typename traits_t<T>::signed_t ST;
  {
    char *buff;
    // create format specifiers before the debug output
    buff = __kmp_str_format("__kmp_dispatch_init_algorithm: T#%%d called "
                            "pr:%%p lb:%%%s ub:%%%s st:%%%s "
                            "schedule:%%d chunk:%%%s nproc:%%%s tid:%%%s\n",
                            traits_t<T>::spec, traits_t<T>::spec,
                            traits_t<ST>::spec, traits_t<ST>::spec,
                            traits_t<T>::spec, traits_t<T>::spec);
    KD_TRACE(10, (buff, gtid, pr, lb, ub, st, schedule, chunk, nproc, tid));
    __kmp_str_free(&buff);
  }
#endif
  /* setup data */
  th = __kmp_threads[gtid];
  team = th->th.th_team;
  active = !team->t.t_serialized;

#if USE_ITT_BUILD
  int itt_need_metadata_reporting =
      __itt_metadata_add_ptr && __kmp_forkjoin_frames_mode == 3 &&
      KMP_MASTER_GTID(gtid) && th->th.th_teams_microtask == NULL &&
      team->t.t_active_level == 1;
#endif

#if KMP_USE_HIER_SCHED
  use_hier = pr->flags.use_hier;
#else
  use_hier = false;
#endif

  /* Pick up the nonmonotonic/monotonic bits from the scheduling type */
  monotonicity = __kmp_get_monotonicity(schedule, use_hier);
  schedule = SCHEDULE_WITHOUT_MODIFIERS(schedule);

  /* Pick up the nomerge/ordered bits from the scheduling type */
  if ((schedule >= kmp_nm_lower) && (schedule < kmp_nm_upper)) {
    pr->flags.nomerge = TRUE;
    schedule =
        (enum sched_type)(((int)schedule) - (kmp_nm_lower - kmp_sch_lower));
  } else {
    pr->flags.nomerge = FALSE;
  }
  pr->type_size = traits_t<T>::type_size; // remember the size of variables
  if (kmp_ord_lower & schedule) {
    pr->flags.ordered = TRUE;
    schedule =
        (enum sched_type)(((int)schedule) - (kmp_ord_lower - kmp_sch_lower));
  } else {
    pr->flags.ordered = FALSE;
  }
  // Ordered overrides nonmonotonic
  if (pr->flags.ordered) {
    monotonicity = SCHEDULE_MONOTONIC;
  }

  if (schedule == kmp_sch_static) {
    schedule = __kmp_static;
  } else {
    if (schedule == kmp_sch_runtime) {
      // Use the scheduling specified by OMP_SCHEDULE (or __kmp_sch_default if
      // not specified)
      schedule = team->t.t_sched.r_sched_type;
      monotonicity = __kmp_get_monotonicity(schedule, use_hier);
      schedule = SCHEDULE_WITHOUT_MODIFIERS(schedule);
      // Detail the schedule if needed (global controls are differentiated
      // appropriately)
      if (schedule == kmp_sch_guided_chunked) {
        schedule = __kmp_guided;
      } else if (schedule == kmp_sch_static) {
        schedule = __kmp_static;
      }
      // Use the chunk size specified by OMP_SCHEDULE (or default if not
      // specified)
      chunk = team->t.t_sched.chunk;
#if USE_ITT_BUILD
      if (cur_chunk)
        *cur_chunk = chunk;
#endif
#ifdef KMP_DEBUG
      {
        char *buff;
        // create format specifiers before the debug output
        buff = __kmp_str_format("__kmp_dispatch_init_algorithm: T#%%d new: "
                                "schedule:%%d chunk:%%%s\n",
                                traits_t<ST>::spec);
        KD_TRACE(10, (buff, gtid, schedule, chunk));
        __kmp_str_free(&buff);
      }
#endif
    } else {
      if (schedule == kmp_sch_guided_chunked) {
        schedule = __kmp_guided;
      }
      if (chunk <= 0) {
        chunk = KMP_DEFAULT_CHUNK;
      }
    }

    if (schedule == kmp_sch_auto) {
      // mapping and differentiation: in the __kmp_do_serial_initialize()
      schedule = __kmp_auto;
#ifdef KMP_DEBUG
      {
        char *buff;
        // create format specifiers before the debug output
        buff = __kmp_str_format(
            "__kmp_dispatch_init_algorithm: kmp_sch_auto: T#%%d new: "
            "schedule:%%d chunk:%%%s\n",
            traits_t<ST>::spec);
        KD_TRACE(10, (buff, gtid, schedule, chunk));
        __kmp_str_free(&buff);
      }
#endif
    }
#if KMP_STATIC_STEAL_ENABLED
    // map nonmonotonic:dynamic to static steal
    if (schedule == kmp_sch_dynamic_chunked) {
      if (monotonicity == SCHEDULE_NONMONOTONIC)
        schedule = kmp_sch_static_steal;
    }
#endif
    /* guided analytical not safe for too many threads */
    if (schedule == kmp_sch_guided_analytical_chunked && nproc > 1 << 20) {
      schedule = kmp_sch_guided_iterative_chunked;
      KMP_WARNING(DispatchManyThreads);
    }
    if (schedule == kmp_sch_runtime_simd) {
      // compiler provides simd_width in the chunk parameter
      schedule = team->t.t_sched.r_sched_type;
      monotonicity = __kmp_get_monotonicity(schedule, use_hier);
      schedule = SCHEDULE_WITHOUT_MODIFIERS(schedule);
      // Detail the schedule if needed (global controls are differentiated
      // appropriately)
      if (schedule == kmp_sch_static || schedule == kmp_sch_auto ||
          schedule == __kmp_static) {
        schedule = kmp_sch_static_balanced_chunked;
      } else {
        if (schedule == kmp_sch_guided_chunked || schedule == __kmp_guided) {
          schedule = kmp_sch_guided_simd;
        }
        chunk = team->t.t_sched.chunk * chunk;
      }
#if USE_ITT_BUILD
      if (cur_chunk)
        *cur_chunk = chunk;
#endif
#ifdef KMP_DEBUG
      {
        char *buff;
        // create format specifiers before the debug output
        buff = __kmp_str_format(
            "__kmp_dispatch_init_algorithm: T#%%d new: schedule:%%d"
            " chunk:%%%s\n",
            traits_t<ST>::spec);
        KD_TRACE(10, (buff, gtid, schedule, chunk));
        __kmp_str_free(&buff);
      }
#endif
    }
    pr->u.p.parm1 = chunk;
  }
  KMP_ASSERT2((kmp_sch_lower < schedule && schedule < kmp_sch_upper),
              "unknown scheduling type");

  pr->u.p.count = 0;

  if (__kmp_env_consistency_check) {
    if (st == 0) {
      __kmp_error_construct(kmp_i18n_msg_CnsLoopIncrZeroProhibited,
                            (pr->flags.ordered ? ct_pdo_ordered : ct_pdo), loc);
    }
  }
  // compute trip count
  if (st == 1) { // most common case
    if (ub >= lb) {
      tc = ub - lb + 1;
    } else { // ub < lb
      tc = 0; // zero-trip
    }
  } else if (st < 0) {
    if (lb >= ub) {
      // AC: cast to unsigned is needed for loops like (i=2B; i>-2B; i-=1B),
      // where the division needs to be unsigned regardless of the result type
      tc = (UT)(lb - ub) / (-st) + 1;
    } else { // lb < ub
      tc = 0; // zero-trip
    }
  } else { // st > 0
    if (ub >= lb) {
      // AC: cast to unsigned is needed for loops like (i=-2B; i<2B; i+=1B),
      // where the division needs to be unsigned regardless of the result type
      tc = (UT)(ub - lb) / st + 1;
    } else { // ub < lb
      tc = 0; // zero-trip
    }
  }

#if KMP_STATS_ENABLED
  if (KMP_MASTER_GTID(gtid)) {
    KMP_COUNT_VALUE(OMP_loop_dynamic_total_iterations, tc);
  }
#endif

  pr->u.p.lb = lb;
  pr->u.p.ub = ub;
  pr->u.p.st = st;
  pr->u.p.tc = tc;

#if KMP_OS_WINDOWS
  pr->u.p.last_upper = ub + st;
#endif /* KMP_OS_WINDOWS */

  /* NOTE: only the active parallel region(s) has active ordered sections */

  if (active) {
    if (pr->flags.ordered) {
      pr->ordered_bumped = 0;
      pr->u.p.ordered_lower = 1;
      pr->u.p.ordered_upper = 0;
    }
  }

  switch (schedule) {
#if (KMP_STATIC_STEAL_ENABLED)
  case kmp_sch_static_steal: {
    T ntc, init;

    KD_TRACE(100,
             ("__kmp_dispatch_init_algorithm: T#%d kmp_sch_static_steal case\n",
              gtid));

    ntc = (tc % chunk ? 1 : 0) + tc / chunk;
    if (nproc > 1 && ntc >= nproc) {
      KMP_COUNT_BLOCK(OMP_LOOP_STATIC_STEAL);
      T id = tid;
      T small_chunk, extras;

      small_chunk = ntc / nproc;
      extras = ntc % nproc;

      init = id * small_chunk + (id < extras ? id : extras);
      pr->u.p.count = init;
      pr->u.p.ub = init + small_chunk + (id < extras ? 1 : 0);

      pr->u.p.parm2 = lb;
      // parm3 is the number of times to attempt stealing which is
      // proportional to the number of chunks per thread up until
      // the maximum value of nproc.
      pr->u.p.parm3 = KMP_MIN(small_chunk + extras, nproc);
      pr->u.p.parm4 = (id + 1) % nproc; // remember neighbour tid
      pr->u.p.st = st;
      if (traits_t<T>::type_size > 4) {
        // AC: TODO: check if 16-byte CAS available and use it to
        // improve performance (probably wait for explicit request
        // before spending time on this).
        // For now use dynamically allocated per-thread lock,
        // free memory in __kmp_dispatch_next when status==0.
        KMP_DEBUG_ASSERT(th->th.th_dispatch->th_steal_lock == NULL);
        th->th.th_dispatch->th_steal_lock =
            (kmp_lock_t *)__kmp_allocate(sizeof(kmp_lock_t));
        __kmp_init_lock(th->th.th_dispatch->th_steal_lock);
      }
      break;
    } else {
      KD_TRACE(100, ("__kmp_dispatch_init_algorithm: T#%d falling-through to "
                     "kmp_sch_static_balanced\n",
                     gtid));
      schedule = kmp_sch_static_balanced;
      /* too few iterations: fall-through to kmp_sch_static_balanced */
    } // if
    /* FALL-THROUGH to static balanced */
    KMP_FALLTHROUGH();
  } // case
#endif
  case kmp_sch_static_balanced: {
    T init, limit;

    KD_TRACE(
        100,
        ("__kmp_dispatch_init_algorithm: T#%d kmp_sch_static_balanced case\n",
         gtid));

    if (nproc > 1) {
      T id = tid;

      if (tc < nproc) {
        if (id < tc) {
          init = id;
          limit = id;
          pr->u.p.parm1 = (id == tc - 1); /* parm1 stores *plastiter */
        } else {
          pr->u.p.count = 1; /* means no more chunks to execute */
          pr->u.p.parm1 = FALSE;
          break;
        }
      } else {
        T small_chunk = tc / nproc;
        T extras = tc % nproc;
        init = id * small_chunk + (id < extras ? id : extras);
        limit = init + small_chunk - (id < extras ? 0 : 1);
        pr->u.p.parm1 = (id == nproc - 1);
      }
    } else {
      if (tc > 0) {
        init = 0;
        limit = tc - 1;
        pr->u.p.parm1 = TRUE;
      } else {
        // zero trip count
        pr->u.p.count = 1; /* means no more chunks to execute */
        pr->u.p.parm1 = FALSE;
        break;
      }
    }
#if USE_ITT_BUILD
    // Calculate chunk for metadata report
    if (itt_need_metadata_reporting)
      if (cur_chunk)
        *cur_chunk = limit - init + 1;
#endif
    if (st == 1) {
      pr->u.p.lb = lb + init;
      pr->u.p.ub = lb + limit;
    } else {
      // calculated upper bound, "ub" is user-defined upper bound
      T ub_tmp = lb + limit * st;
      pr->u.p.lb = lb + init * st;
      // adjust upper bound to "ub" if needed, so that MS lastprivate will match
      // it exactly
      if (st > 0) {
        pr->u.p.ub = (ub_tmp + st > ub ? ub : ub_tmp);
      } else {
        pr->u.p.ub = (ub_tmp + st < ub ? ub : ub_tmp);
      }
    }
    if (pr->flags.ordered) {
      pr->u.p.ordered_lower = init;
      pr->u.p.ordered_upper = limit;
    }
    break;
  } // case
  case kmp_sch_static_balanced_chunked: {
    // similar to balanced, but chunk adjusted to multiple of simd width
    T nth = nproc;
    KD_TRACE(100, ("__kmp_dispatch_init_algorithm: T#%d runtime(simd:static)"
                   " -> falling-through to static_greedy\n",
                   gtid));
    schedule = kmp_sch_static_greedy;
    if (nth > 1)
      pr->u.p.parm1 = ((tc + nth - 1) / nth + chunk - 1) & ~(chunk - 1);
    else
      pr->u.p.parm1 = tc;
    break;
  } // case
  case kmp_sch_guided_simd:
  case kmp_sch_guided_iterative_chunked: {
    KD_TRACE(
        100,
        ("__kmp_dispatch_init_algorithm: T#%d kmp_sch_guided_iterative_chunked"
         " case\n",
         gtid));

    if (nproc > 1) {
      if ((2L * chunk + 1) * nproc >= tc) {
        /* chunk size too large, switch to dynamic */
        schedule = kmp_sch_dynamic_chunked;
      } else {
        // when remaining iters become less than parm2 - switch to dynamic
        pr->u.p.parm2 = guided_int_param * nproc * (chunk + 1);
        *(double *)&pr->u.p.parm3 =
            guided_flt_param / nproc; // may occupy parm3 and parm4
      }
    } else {
      KD_TRACE(100, ("__kmp_dispatch_init_algorithm: T#%d falling-through to "
                     "kmp_sch_static_greedy\n",
                     gtid));
      schedule = kmp_sch_static_greedy;
      /* team->t.t_nproc == 1: fall-through to kmp_sch_static_greedy */
      KD_TRACE(
          100,
          ("__kmp_dispatch_init_algorithm: T#%d kmp_sch_static_greedy case\n",
           gtid));
      pr->u.p.parm1 = tc;
    } // if
  } // case
  break;
  case kmp_sch_guided_analytical_chunked: {
    KD_TRACE(100, ("__kmp_dispatch_init_algorithm: T#%d "
                   "kmp_sch_guided_analytical_chunked case\n",
                   gtid));

    if (nproc > 1) {
      if ((2L * chunk + 1) * nproc >= tc) {
        /* chunk size too large, switch to dynamic */
        schedule = kmp_sch_dynamic_chunked;
      } else {
        /* commonly used term: (2 nproc - 1)/(2 nproc) */
        DBL x;

#if KMP_USE_X87CONTROL
        /* Linux* OS already has 64-bit computation by default for long double,
           and on Windows* OS on Intel(R) 64, /Qlong_double doesn't work. On
           Windows* OS on IA-32 architecture, we need to set precision to 64-bit
           instead of the default 53-bit. Even though long double doesn't work
           on Windows* OS on Intel(R) 64, the resulting lack of precision is not
           expected to impact the correctness of the algorithm, but this has not
           been mathematically proven. */
        // save original FPCW and set precision to 64-bit, as
        // Windows* OS on IA-32 architecture defaults to 53-bit
        unsigned int oldFpcw = _control87(0, 0);
        _control87(_PC_64, _MCW_PC); // 0,0x30000
#endif
        /* value used for comparison in solver for cross-over point */
        long double target = ((long double)chunk * 2 + 1) * nproc / tc;

        /* crossover point--chunk indexes equal to or greater than
           this point switch to dynamic-style scheduling */
        UT cross;

        /* commonly used term: (2 nproc - 1)/(2 nproc) */
        x = (long double)1.0 - (long double)0.5 / nproc;

#ifdef KMP_DEBUG
        { // test natural alignment
          struct _test_a {
            char a;
            union {
              char b;
              DBL d;
            };
          } t;
          ptrdiff_t natural_alignment =
              (ptrdiff_t)&t.b - (ptrdiff_t)&t - (ptrdiff_t)1;
          //__kmp_warn( " %llx %llx %lld", (long long)&t.d, (long long)&t, (long
          // long)natural_alignment );
          KMP_DEBUG_ASSERT(
              (((ptrdiff_t)&pr->u.p.parm3) & (natural_alignment)) == 0);
        }
#endif // KMP_DEBUG

        /* save the term in thread private dispatch structure */
        *(DBL *)&pr->u.p.parm3 = x;

        /* solve for the crossover point to the nearest integer i for which C_i
           <= chunk */
        {
          UT left, right, mid;
          long double p;

          /* estimate initial upper and lower bound */

          /* doesn't matter what value right is as long as it is positive, but
             it affects performance of the solver */
          right = 229;
          p = __kmp_pow<UT>(x, right);
          if (p > target) {
            do {
              p *= p;
              right <<= 1;
            } while (p > target && right < (1 << 27));
            /* lower bound is previous (failed) estimate of upper bound */
            left = right >> 1;
          } else {
            left = 0;
          }

          /* bisection root-finding method */
          while (left + 1 < right) {
            mid = (left + right) / 2;
            if (__kmp_pow<UT>(x, mid) > target) {
              left = mid;
            } else {
              right = mid;
            }
          } // while
          cross = right;
        }
        /* assert sanity of computed crossover point */
        KMP_ASSERT(cross && __kmp_pow<UT>(x, cross - 1) > target &&
                   __kmp_pow<UT>(x, cross) <= target);

        /* save the crossover point in thread private dispatch structure */
        pr->u.p.parm2 = cross;

// C75803
#if ((KMP_OS_LINUX || KMP_OS_WINDOWS) && KMP_ARCH_X86) && (!defined(KMP_I8))
#define GUIDED_ANALYTICAL_WORKAROUND (*(DBL *)&pr->u.p.parm3)
#else
#define GUIDED_ANALYTICAL_WORKAROUND (x)
#endif
        /* dynamic-style scheduling offset */
        pr->u.p.count = tc - __kmp_dispatch_guided_remaining(
                                 tc, GUIDED_ANALYTICAL_WORKAROUND, cross) -
                        cross * chunk;
#if KMP_USE_X87CONTROL
        // restore FPCW
        _control87(oldFpcw, _MCW_PC);
#endif
      } // if
    } else {
      KD_TRACE(100, ("__kmp_dispatch_init_algorithm: T#%d falling-through to "
                     "kmp_sch_static_greedy\n",
                     gtid));
      schedule = kmp_sch_static_greedy;
      /* team->t.t_nproc == 1: fall-through to kmp_sch_static_greedy */
      pr->u.p.parm1 = tc;
    } // if
  } // case
  break;
  case kmp_sch_static_greedy:
    KD_TRACE(
        100,
        ("__kmp_dispatch_init_algorithm: T#%d kmp_sch_static_greedy case\n",
         gtid));
    pr->u.p.parm1 = (nproc > 1) ? (tc + nproc - 1) / nproc : tc;
    break;
  case kmp_sch_static_chunked:
  case kmp_sch_dynamic_chunked:
    if (pr->u.p.parm1 <= 0) {
      pr->u.p.parm1 = KMP_DEFAULT_CHUNK;
    }
    KD_TRACE(100, ("__kmp_dispatch_init_algorithm: T#%d "
                   "kmp_sch_static_chunked/kmp_sch_dynamic_chunked cases\n",
                   gtid));
    break;
  case kmp_sch_trapezoidal: {
    /* TSS: trapezoid self-scheduling, minimum chunk_size = parm1 */

    T parm1, parm2, parm3, parm4;
    KD_TRACE(100,
             ("__kmp_dispatch_init_algorithm: T#%d kmp_sch_trapezoidal case\n",
              gtid));

    parm1 = chunk;

    /* F : size of the first cycle */
    parm2 = (tc / (2 * nproc));

    if (parm2 < 1) {
      parm2 = 1;
    }

    /* L : size of the last cycle.  Make sure the last cycle is not larger
       than the first cycle. */
    if (parm1 < 1) {
      parm1 = 1;
    } else if (parm1 > parm2) {
      parm1 = parm2;
    }

    /* N : number of cycles */
    parm3 = (parm2 + parm1);
    parm3 = (2 * tc + parm3 - 1) / parm3;

    if (parm3 < 2) {
      parm3 = 2;
    }

    /* sigma : decreasing incr of the trapezoid */
    parm4 = (parm3 - 1);
    parm4 = (parm2 - parm1) / parm4;

    // pointless check, because parm4 >= 0 always
    // if ( parm4 < 0 ) {
    //    parm4 = 0;
    //}

    pr->u.p.parm1 = parm1;
    pr->u.p.parm2 = parm2;
    pr->u.p.parm3 = parm3;
    pr->u.p.parm4 = parm4;
  } // case
  break;

  default: {
    __kmp_fatal(KMP_MSG(UnknownSchedTypeDetected), // Primary message
                KMP_HNT(GetNewerLibrary), // Hint
                __kmp_msg_null // Variadic argument list terminator
                );
  } break;
  } // switch
  pr->schedule = schedule;
}